

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsReadOnlyLoad(Instruction *this)

{
  IRContext *this_00;
  TypeManager *this_01;
  bool bVar1;
  bool bVar2;
  uint32_t id;
  int iVar3;
  Instruction *this_02;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  
  bVar1 = spvOpcodeIsLoad(this->opcode_);
  if (bVar1) {
    this_02 = GetBaseAddress(this);
    bVar1 = this_02 != (Instruction *)0x0;
    if (this_02 == (Instruction *)0x0) {
      return bVar1;
    }
    if ((this_02->opcode_ == OpVariable) && (bVar2 = IsReadOnlyPointer(this_02), bVar2)) {
      return bVar1;
    }
    if (this_02->opcode_ == OpLoad) {
      this_00 = this->context_;
      if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(this_00);
      }
      this_01 = (this_00->type_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
      id = 0;
      if (this_02->has_type_id_ == true) {
        id = GetSingleWordOperand(this_02,0);
      }
      pTVar4 = analysis::TypeManager::GetType(this_01,id);
      iVar3 = (*pTVar4->_vptr_Type[0x16])(pTVar4);
      if (CONCAT44(extraout_var,iVar3) != 0) {
        iVar3 = (*pTVar4->_vptr_Type[0x16])(pTVar4);
        lVar5 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar3) + 0x28) + 0x90))();
        if (*(int *)(lVar5 + 0x3c) == 1) {
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsReadOnlyLoad() const {
  if (IsLoad()) {
    Instruction* address_def = GetBaseAddress();
    if (!address_def) {
      return false;
    }

    if (address_def->opcode() == spv::Op::OpVariable) {
      if (address_def->IsReadOnlyPointer()) {
        return true;
      }
    }

    if (address_def->opcode() == spv::Op::OpLoad) {
      const analysis::Type* address_type =
          context()->get_type_mgr()->GetType(address_def->type_id());
      if (address_type->AsSampledImage() != nullptr) {
        const auto* image_type =
            address_type->AsSampledImage()->image_type()->AsImage();
        if (image_type->sampled() == 1) {
          return true;
        }
      }
    }
  }
  return false;
}